

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O3

Function * getUsingFunction(Value *V)

{
  User UVar1;
  User *Ptr;
  void **ppvVar2;
  Function *pFVar3;
  Function *pFVar4;
  bool bVar5;
  SmallVector<llvm::User_*,_4U> Worklist;
  SmallSet<llvm::User_*,_4U,_std::less<llvm::User_*>_> Visited;
  SmallVectorImpl<llvm::User_*> local_b8;
  undefined1 local_a8 [32];
  SmallPtrSetImplBase local_88;
  void *local_68 [4];
  pair<llvm::SmallPtrSetIterator<llvm::User_*>,_bool> local_48;
  
  local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
  super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.BeginX =
       local_a8;
  local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
  super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.Size = 0;
  local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
  super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.Capacity =
       4;
  local_88.SmallArray = local_68;
  local_88.CurArraySize = 4;
  local_88.NumNonEmpty = 0;
  local_88.NumTombstones = 0;
  local_88.CurArray = local_88.SmallArray;
  llvm::Value::assertModuleIsMaterializedImpl();
  while (V = *(Value **)(V + 8), V != (Value *)0x0) {
    llvm::SmallVectorTemplateBase<llvm::User_*,_true>::push_back
              (&local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>,
               *(ValueParamT *)(V + 0x18));
  }
  if (local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
      super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.Size
      == 0) {
LAB_00115cd0:
    pFVar4 = (Function *)0x0;
  }
  else {
    pFVar3 = (Function *)0x0;
    do {
      Ptr = llvm::SmallVectorImpl<llvm::User_*>::pop_back_val(&local_b8);
      ppvVar2 = llvm::SmallPtrSetImplBase::find_imp(&local_88,Ptr);
      pFVar4 = pFVar3;
      if (ppvVar2 ==
          local_88.CurArray +
          *(uint *)((long)local_68 + (ulong)(local_88.CurArray == local_88.SmallArray) * 4 + -0x10))
      {
        llvm::SmallPtrSetImpl<llvm::User_*>::insert
                  (&local_48,(SmallPtrSetImpl<llvm::User_*> *)&local_88,Ptr);
        if (Ptr == (User *)0x0) {
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,
                        "static bool llvm::isa_impl_cl<llvm::ConstantExpr, const llvm::User *>::doit(const From *) [To = llvm::ConstantExpr, From = const llvm::User *]"
                       );
        }
        UVar1 = Ptr[0x10];
        if ((2 < (byte)UVar1 - 8) && (UVar1 != (User)0x5)) {
          if (UVar1 != (User)0x3) {
            if ((0x1a < (byte)UVar1) &&
               ((pFVar4 = *(Function **)(*(long *)(Ptr + 0x28) + 0x38), pFVar3 == (Function *)0x0 ||
                (bVar5 = pFVar4 == pFVar3, pFVar4 = pFVar3, bVar5)))) goto LAB_00115c2d;
            goto LAB_00115cd0;
          }
          if (8 < (*(uint *)(Ptr + 0x20) & 0xf)) goto LAB_00115cd0;
          pFVar4 = (Function *)0x0;
          if ((0x18eU >> (*(uint *)(Ptr + 0x20) & 0xf) & 1) == 0) break;
        }
        llvm::Value::assertModuleIsMaterializedImpl();
        while (Ptr = *(User **)(Ptr + 8), pFVar4 = pFVar3, Ptr != (User *)0x0) {
          llvm::SmallVectorTemplateBase<llvm::User_*,_true>::push_back
                    (&local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>,
                     *(ValueParamT *)(Ptr + 0x18));
        }
      }
LAB_00115c2d:
      pFVar3 = pFVar4;
    } while (local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
             super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>
             .Size != 0);
  }
  if (local_88.CurArray != local_88.SmallArray) {
    free(local_88.CurArray);
  }
  if ((undefined1 *)
      local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
      super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.BeginX
      != local_a8) {
    free(local_b8.super_SmallVectorTemplateBase<llvm::User_*,_true>.
         super_SmallVectorTemplateCommon<llvm::User_*,_void>.super_SmallVectorBase<unsigned_int>.
         BeginX);
  }
  return pFVar4;
}

Assistant:

static Function *getUsingFunction(Value &V) {
  Function *F = nullptr;

  SmallVector<User *, 4> Worklist;
  SmallSet<User *, 4> Visited;

  for (auto *U : V.users())
    Worklist.push_back(U);
  while (!Worklist.empty()) {
    auto *U = Worklist.pop_back_val();

    if (Visited.count(U))
      continue;
    else
      Visited.insert(U);

    if (isa<ConstantExpr>(U) || isa<ConstantAggregate>(U) ||
        isa<GlobalVariable>(U)) {
      if (isa<GlobalVariable>(U) &&
          !cast<GlobalVariable>(U)->isDiscardableIfUnused())
        return nullptr;
      for (auto *UU : U->users()) {
        Worklist.push_back(UU);
      }
      continue;
    }

    auto *I = dyn_cast<Instruction>(U);
    if (!I)
      return nullptr;
    if (!F)
      F = I->getParent()->getParent();
    if (I->getParent()->getParent() != F)
      return nullptr;
  }

  return F;
}